

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  Mat int8_weight_data_g;
  Mat weight_data_g;
  Mat int8_weight_data;
  Option opt_q;
  
  iVar2 = 0;
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    Mat::Mat(&int8_weight_data,this->weight_data_size,1,(Allocator *)0x0);
    if ((int8_weight_data.data == (void *)0x0) ||
       ((long)int8_weight_data.c * int8_weight_data.cstep == 0)) {
      Mat::~Mat(&int8_weight_data);
      iVar2 = -100;
    }
    else {
      iVar2 = this->group;
      iVar1 = this->weight_data_size / iVar2;
      sVar5 = (size_t)iVar1;
      lVar3 = 0;
      for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
        opt_q.lightmode = opt->lightmode;
        opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_q.num_threads = opt->num_threads;
        opt_q.workspace_allocator = opt->workspace_allocator;
        opt_q.use_winograd_convolution = opt->use_winograd_convolution;
        opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_q.use_int8_inference = opt->use_int8_inference;
        opt_q.use_vulkan_compute = opt->use_vulkan_compute;
        opt_q.use_fp16_packed = opt->use_fp16_packed;
        opt_q.use_fp16_storage = opt->use_fp16_storage;
        opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_q.use_int8_storage = opt->use_int8_storage;
        opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_q.use_packing_layout = opt->use_packing_layout;
        opt_q.use_shader_pack8 = opt->use_shader_pack8;
        opt_q.use_bf16_storage = opt->use_bf16_storage;
        opt_q._36_4_ = *(undefined4 *)&opt->field_0x24;
        opt_q.blob_allocator = int8_weight_data.allocator;
        weight_data_g.elemsize = (this->weight_data).elemsize;
        weight_data_g.data =
             (void *)(weight_data_g.elemsize * lVar3 + (long)(this->weight_data).data);
        weight_data_g.elempack = (this->weight_data).elempack;
        weight_data_g.allocator = (this->weight_data).allocator;
        weight_data_g.refcount = (int *)0x0;
        int8_weight_data_g.dims = 1;
        weight_data_g.h = 1;
        weight_data_g.c = 1;
        int8_weight_data_g.data =
             (void *)(int8_weight_data.elemsize * lVar3 + (long)int8_weight_data.data);
        int8_weight_data_g.refcount = (int *)0x0;
        int8_weight_data_g.elemsize = int8_weight_data.elemsize;
        int8_weight_data_g.elempack = int8_weight_data.elempack;
        int8_weight_data_g.allocator = int8_weight_data.allocator;
        int8_weight_data_g.h = 1;
        int8_weight_data_g.c = 1;
        int8_weight_data_g.w = iVar1;
        int8_weight_data_g.cstep = sVar5;
        weight_data_g.dims = int8_weight_data_g.dims;
        weight_data_g.w = iVar1;
        weight_data_g.cstep = sVar5;
        quantize_float32_to_int8
                  (&weight_data_g,&int8_weight_data_g,
                   *(float *)((long)(this->weight_data_int8_scales).data + lVar4 * 4),&opt_q);
        Mat::~Mat(&int8_weight_data_g);
        Mat::~Mat(&weight_data_g);
        iVar2 = this->group;
        lVar3 = lVar3 + sVar5;
      }
      Mat::operator=(&this->weight_data,&int8_weight_data);
      Mat::~Mat(&int8_weight_data);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            quantize_float32_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales[g], opt_q);
        }

        weight_data = int8_weight_data;
    }

    return 0;
}